

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFParser.cpp
# Opt level: O2

EStatusCode __thiscall
PDFParser::ParseXrefFromXrefStream
          (PDFParser *this,XrefEntryInputVector *inXrefTable,ObjectIDType inXrefSize,
          PDFStreamInput *inXrefStream,ObjectIDType *outReadTableSize)

{
  EPDFObjectType EVar1;
  EStatusCode EVar2;
  IByteReader *inReadFrom;
  PDFDictionary *pPVar3;
  PDFObject *pPVar4;
  unsigned_long uVar5;
  int *inEntryWidths;
  PDFInteger *pPVar6;
  longlong lVar7;
  LongFilePositionType inPosition;
  ObjectIDType inSegmentStartObject;
  ulong uVar8;
  Trace *pTVar9;
  ulong uVar10;
  char *inFormat;
  int iVar11;
  allocator<char> local_c1;
  PDFObjectCastPtr<PDFInteger> widthObject;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  ulong local_98;
  PDFObjectCastPtr<PDFArray> wArray;
  PDFObjectCastPtr<PDFArray> subsectionsIndex;
  RefCountPtr<PDFDictionary> streamDictionary;
  PDFObjectCastPtr<PDFInteger> xrefSize;
  
  *outReadTableSize = inXrefSize;
  inReadFrom = CreateInputStreamReader(this,inXrefStream);
  if (inReadFrom == (IByteReader *)0x0) {
    return eFailure;
  }
  pPVar3 = PDFStreamInput::QueryStreamDictionary(inXrefStream);
  streamDictionary._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d830;
  streamDictionary.mValue = pPVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&widthObject,"W",(allocator<char> *)&subsectionsIndex);
  pPVar4 = QueryDictionaryObject(this,pPVar3,(string *)&widthObject);
  wArray.super_RefCountPtr<PDFArray>.mValue = PDFObjectCast<PDFArray>(pPVar4);
  wArray.super_RefCountPtr<PDFArray>._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d8f8;
  std::__cxx11::string::~string((string *)&widthObject);
  if (wArray.super_RefCountPtr<PDFArray>.mValue == (PDFArray *)0x0) {
    pTVar9 = Trace::DefaultTrace();
    inEntryWidths = (int *)0x0;
    Trace::TraceToLog(pTVar9,"PDFParser::ParseXrefFromXrefStream, W array not available. failing");
    EVar2 = eFailure;
    goto LAB_001a6e71;
  }
  uVar5 = PDFArray::GetLength(wArray.super_RefCountPtr<PDFArray>.mValue);
  inEntryWidths = (int *)operator_new__(-(ulong)(uVar5 >> 0x3e != 0) | uVar5 << 2);
  uVar10 = 0;
  iVar11 = 0;
  do {
    uVar5 = PDFArray::GetLength(wArray.super_RefCountPtr<PDFArray>.mValue);
    if (uVar5 <= uVar10) break;
    pPVar4 = PDFArray::QueryObject(wArray.super_RefCountPtr<PDFArray>.mValue,uVar10);
    pPVar6 = PDFObjectCast<PDFInteger>(pPVar4);
    widthObject.super_RefCountPtr<PDFInteger>._vptr_RefCountPtr =
         (_func_int **)&PTR__RefCountPtr_0036f160;
    widthObject.super_RefCountPtr<PDFInteger>.mValue = pPVar6;
    if (pPVar6 == (PDFInteger *)0x0) {
      pTVar9 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar9,
                        "PDFParser::ParseXrefFromXrefStream, wrong items in width array (supposed to have only integers)"
                       );
      iVar11 = -1;
    }
    else {
      lVar7 = PDFInteger::GetValue(pPVar6);
      inEntryWidths[uVar10] = (int)lVar7;
    }
    RefCountPtr<PDFInteger>::~RefCountPtr(&widthObject.super_RefCountPtr<PDFInteger>);
    uVar10 = uVar10 + 1;
  } while (pPVar6 != (PDFInteger *)0x0);
  pPVar3 = streamDictionary.mValue;
  if (iVar11 != 0) {
    EVar2 = eFailure;
    goto LAB_001a6e71;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&widthObject,"Index",(allocator<char> *)&xrefSize);
  pPVar4 = QueryDictionaryObject(this,pPVar3,(string *)&widthObject);
  subsectionsIndex.super_RefCountPtr<PDFArray>.mValue = PDFObjectCast<PDFArray>(pPVar4);
  subsectionsIndex.super_RefCountPtr<PDFArray>._vptr_RefCountPtr =
       (_func_int **)&PTR__RefCountPtr_0036d8f8;
  std::__cxx11::string::~string((string *)&widthObject);
  inPosition = PDFStreamInput::GetStreamContentStart(inXrefStream);
  MovePositionInStream(this,inPosition);
  pPVar3 = streamDictionary.mValue;
  if (subsectionsIndex.super_RefCountPtr<PDFArray>.mValue == (PDFArray *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&widthObject,"Size",&local_c1);
    pPVar4 = QueryDictionaryObject(this,pPVar3,(string *)&widthObject);
    pPVar6 = PDFObjectCast<PDFInteger>(pPVar4);
    xrefSize.super_RefCountPtr<PDFInteger>._vptr_RefCountPtr =
         (_func_int **)&PTR__RefCountPtr_0036f160;
    xrefSize.super_RefCountPtr<PDFInteger>.mValue = pPVar6;
    std::__cxx11::string::~string((string *)&widthObject);
    if (pPVar6 == (PDFInteger *)0x0) {
      pTVar9 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar9,
                        "PDFParser::ParseXrefFromXrefStream, xref size does not exist for this stream"
                       );
      EVar2 = eFailure;
    }
    else {
      uVar10 = PDFInteger::GetValue(pPVar6);
      if (inXrefSize < uVar10) {
        EVar2 = eSuccess;
        if (this->mAllowExtendingSegments != true) goto LAB_001a6e26;
        *outReadTableSize = uVar10;
      }
      uVar5 = PDFArray::GetLength(wArray.super_RefCountPtr<PDFArray>.mValue);
      EVar2 = ReadXrefStreamSegment(this,inXrefTable,0,uVar10,inReadFrom,inEntryWidths,uVar5);
    }
LAB_001a6e26:
    RefCountPtr<PDFInteger>::~RefCountPtr(&xrefSize.super_RefCountPtr<PDFInteger>);
  }
  else {
    PDFArray::GetIterator(subsectionsIndex.super_RefCountPtr<PDFArray>.mValue);
    EVar2 = eSuccess;
    local_98 = inXrefSize;
    while ((_func_int **)local_b0._M_allocated_capacity !=
           widthObject.super_RefCountPtr<PDFInteger>._vptr_RefCountPtr) {
      if ((char)widthObject.super_RefCountPtr<PDFInteger>.mValue == '\x01') {
        widthObject.super_RefCountPtr<PDFInteger>.mValue =
             (PDFInteger *)
             ((ulong)widthObject.super_RefCountPtr<PDFInteger>.mValue & 0xffffffffffffff00);
        if (EVar2 != eSuccess) break;
      }
      else {
        local_b0._M_allocated_capacity = local_b0._M_allocated_capacity + 8;
        if ((EVar2 != eSuccess) ||
           ((_func_int **)local_b0._M_allocated_capacity ==
            widthObject.super_RefCountPtr<PDFInteger>._vptr_RefCountPtr)) break;
      }
      EVar1 = PDFObject::GetType(*(PDFObject **)local_b0._M_allocated_capacity);
      if (EVar1 != ePDFObjectInteger) {
        pTVar9 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar9,
                          "PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream"
                         );
LAB_001a6e63:
        EVar2 = eFailure;
        break;
      }
      inSegmentStartObject = PDFInteger::GetValue(*(PDFInteger **)local_b0._M_allocated_capacity);
      if ((_func_int **)local_b0._M_allocated_capacity ==
          widthObject.super_RefCountPtr<PDFInteger>._vptr_RefCountPtr) {
LAB_001a6df9:
        pTVar9 = Trace::DefaultTrace();
        inFormat = 
        "PDFParser::ParseXrefFromXrefStream,Index array of xref stream should have an even number of values"
        ;
LAB_001a6e59:
        Trace::TraceToLog(pTVar9,inFormat);
        goto LAB_001a6e63;
      }
      if ((char)widthObject.super_RefCountPtr<PDFInteger>.mValue == '\x01') {
        widthObject.super_RefCountPtr<PDFInteger>.mValue =
             (PDFInteger *)
             ((ulong)widthObject.super_RefCountPtr<PDFInteger>.mValue & 0xffffffffffffff00);
      }
      else {
        local_b0._M_allocated_capacity = local_b0._M_allocated_capacity + 8;
        if ((_func_int **)local_b0._M_allocated_capacity ==
            widthObject.super_RefCountPtr<PDFInteger>._vptr_RefCountPtr) goto LAB_001a6df9;
      }
      EVar1 = PDFObject::GetType(*(PDFObject **)local_b0._M_allocated_capacity);
      if (EVar1 != ePDFObjectInteger) {
        pTVar9 = Trace::DefaultTrace();
        inFormat = 
        "PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream";
        goto LAB_001a6e59;
      }
      uVar10 = PDFInteger::GetValue(*(PDFInteger **)local_b0._M_allocated_capacity);
      uVar8 = uVar10 + inSegmentStartObject;
      if (local_98 < uVar8) {
        if (this->mAllowExtendingSegments != true) {
          EVar2 = eSuccess;
          break;
        }
        *outReadTableSize = uVar8;
        local_98 = uVar8;
      }
      uVar5 = PDFArray::GetLength(wArray.super_RefCountPtr<PDFArray>.mValue);
      uVar8 = local_98 - inSegmentStartObject;
      if (uVar10 <= local_98 - inSegmentStartObject) {
        uVar8 = uVar10;
      }
      EVar2 = ReadXrefStreamSegment
                        (this,inXrefTable,inSegmentStartObject,uVar8,inReadFrom,inEntryWidths,uVar5)
      ;
    }
  }
  RefCountPtr<PDFArray>::~RefCountPtr(&subsectionsIndex.super_RefCountPtr<PDFArray>);
LAB_001a6e71:
  RefCountPtr<PDFArray>::~RefCountPtr(&wArray.super_RefCountPtr<PDFArray>);
  RefCountPtr<PDFDictionary>::~RefCountPtr(&streamDictionary);
  (*inReadFrom->_vptr_IByteReader[1])(inReadFrom);
  if (inEntryWidths != (int *)0x0) {
    operator_delete__(inEntryWidths);
  }
  return EVar2;
}

Assistant:

EStatusCode PDFParser::ParseXrefFromXrefStream(XrefEntryInputVector& inXrefTable,
                                                   ObjectIDType inXrefSize,
                                                   PDFStreamInput* inXrefStream,
                                                   ObjectIDType* outReadTableSize)
{
	// 1. Setup the stream to read from the stream start location
	// 2. Set it up with an input stream to decode if required
	// 3. if there are subsections, loop them, otherwise assume a single section of 0..size
	// 4. for each subsection use the base number as starting, and count as well, to read the stream entries to the right position in the table
	//    The entries are read using the "W" value. make sure to read even values that you don't need.

	EStatusCode status = PDFHummus::eSuccess;

    *outReadTableSize = inXrefSize;

	IByteReader* xrefStreamSource = CreateInputStreamReader(inXrefStream);
	int* widthsArray = NULL;

	do
	{
		if(!xrefStreamSource)
		{
			status = PDFHummus::eFailure;
			break;
		}

		RefCountPtr<PDFDictionary> streamDictionary(inXrefStream->QueryStreamDictionary());

		// setup w array
		PDFObjectCastPtr<PDFArray> wArray(QueryDictionaryObject(streamDictionary.GetPtr(),"W"));
		if(!wArray)
		{
			TRACE_LOG("PDFParser::ParseXrefFromXrefStream, W array not available. failing");
			status = PDFHummus::eFailure;
			break;
		}

		widthsArray = new int[wArray->GetLength()];
		for(unsigned long i=0;i <wArray->GetLength();++i)
		{
			PDFObjectCastPtr<PDFInteger> widthObject(wArray->QueryObject(i));
			if(!widthObject)
			{
				TRACE_LOG("PDFParser::ParseXrefFromXrefStream, wrong items in width array (supposed to have only integers)");
				status = PDFHummus::eFailure;
				break;
			}
			widthsArray[i] = (int)widthObject->GetValue();
		}
		if(status != PDFHummus::eSuccess)
			break;

		// read the segments from the stream
		PDFObjectCastPtr<PDFArray> subsectionsIndex(QueryDictionaryObject(streamDictionary.GetPtr(),"Index"));
		MovePositionInStream(inXrefStream->GetStreamContentStart());

		if(!subsectionsIndex)
		{
			PDFObjectCastPtr<PDFInteger> xrefSize(QueryDictionaryObject(streamDictionary.GetPtr(),"Size"));
			if(!xrefSize)
			{
				TRACE_LOG("PDFParser::ParseXrefFromXrefStream, xref size does not exist for this stream");
				status = PDFHummus::eFailure;
				break;
			}

            // if reading objects past expected range interesting consult policy
            ObjectIDType readXrefSize = (ObjectIDType)xrefSize->GetValue();

            if(readXrefSize > inXrefSize)
            {
                if(mAllowExtendingSegments)
                {
                    inXrefSize = readXrefSize;
                    *outReadTableSize = readXrefSize;
                }
                else
                    break;
            }
			status = ReadXrefStreamSegment(inXrefTable,0,readXrefSize,xrefStreamSource,widthsArray,wArray->GetLength());
		}
		else
		{
			SingleValueContainerIterator<PDFObjectVector> segmentsIterator  = subsectionsIndex->GetIterator();
			PDFInteger* segmentValue;
			while(segmentsIterator.MoveNext() && PDFHummus::eSuccess == status)
			{
				if(segmentsIterator.GetItem()->GetType() != PDFObject::ePDFObjectInteger)
				{
					TRACE_LOG("PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream");
					status = PDFHummus::eFailure;
					break;
				}
				segmentValue = (PDFInteger*)(segmentsIterator.GetItem());

				ObjectIDType startObject = (ObjectIDType)segmentValue->GetValue();
				if(!segmentsIterator.MoveNext())
				{
					TRACE_LOG("PDFParser::ParseXrefFromXrefStream,Index array of xref stream should have an even number of values");
					status = PDFHummus::eFailure;
					break;
				}

				if(segmentsIterator.GetItem()->GetType() != PDFObject::ePDFObjectInteger)
				{
					TRACE_LOG("PDFParser::ParseXrefFromXrefStream, found non integer value in Index array of xref stream");
					status = PDFHummus::eFailure;
					break;
				}
				segmentValue = (PDFInteger*)(segmentsIterator.GetItem());

				ObjectIDType objectsCount = (ObjectIDType)segmentValue->GetValue();
				ObjectIDType readXrefSize = startObject +  objectsCount;

				// if reading objects past expected range interesting consult policy
				if(readXrefSize > inXrefSize)
                {
                    if(mAllowExtendingSegments)
                    {
                        inXrefSize = readXrefSize;
                        *outReadTableSize = readXrefSize;
                    }
                    else
                        break;
                }
				status = ReadXrefStreamSegment(inXrefTable,startObject,std::min<ObjectIDType>(objectsCount,inXrefSize - startObject),xrefStreamSource,widthsArray,wArray->GetLength());
			}
		}
	}while(false);

	delete xrefStreamSource;
	delete[] widthsArray;
	return status;
}